

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::ShouldResend(CWallet *this)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  time_point tVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fBroadcastTransactions == true) {
    if (this->m_chain == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    cVar2 = (**(code **)(*(long *)this->m_chain + 0x110))();
    if (cVar2 != '\0') {
      tVar4 = NodeClock::now();
      bVar3 = (this->m_next_resend).__d.__r <= (long)tVar4.__d.__r;
      goto LAB_00163fdb;
    }
  }
  bVar3 = false;
LAB_00163fdb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ShouldResend() const
{
    // Don't attempt to resubmit if the wallet is configured to not broadcast
    if (!fBroadcastTransactions) return false;

    // During reindex, importing and IBD, old wallet transactions become
    // unconfirmed. Don't resend them as that would spam other nodes.
    // We only allow forcing mempool submission when not relaying to avoid this spam.
    if (!chain().isReadyToBroadcast()) return false;

    // Do this infrequently and randomly to avoid giving away
    // that these are our transactions.
    if (NodeClock::now() < m_next_resend) return false;

    return true;
}